

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  basic_format_specs<wchar_t> *pbVar3;
  int iVar4;
  wchar_t wVar5;
  uint uVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  _Alloc_hider _Var9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  string groups;
  format_specs local_e8;
  string local_b8;
  ulong local_98;
  ulong uStack_90;
  wchar_t local_88 [2];
  wchar_t awStack_80 [2];
  wchar_t local_78;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_68;
  
  grouping_impl<wchar_t>(&local_b8,(locale_ref)(this->writer->locale_).locale_);
  if (local_b8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    wVar5 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
    if (wVar5 == L'\0') {
      on_dec(this);
    }
    else {
      local_68.f.abs_value = this->abs_value;
      uVar7 = 0x1f;
      if ((local_68.f.abs_value | 1) != 0) {
        for (; (local_68.f.abs_value | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar6 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      uVar10 = uVar6 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar6 * 4) <=
                       local_68.f.abs_value);
      pcVar1 = local_b8._M_dataplus._M_p + local_b8._M_string_length;
      _Var9._M_p = local_b8._M_dataplus._M_p;
      local_68.f.size = uVar10;
      uVar7 = uVar10;
      if (local_b8._M_string_length != 0) {
        iVar4 = (int)local_b8._M_string_length;
        _Var8._M_p = local_b8._M_dataplus._M_p;
        do {
          cVar2 = *_Var8._M_p;
          uVar12 = uVar7 - (int)cVar2;
          _Var9._M_p = _Var8._M_p;
          local_68.f.size = uVar10;
          if ((uVar12 == 0 || (int)uVar7 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar10 = uVar10 + 1;
          _Var8._M_p = _Var8._M_p + 1;
          local_b8._M_string_length = local_b8._M_string_length - 1;
          _Var9._M_p = pcVar1;
          local_68.f.size =
               iVar4 + uVar6 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                         (ulong)uVar6 * 4) <= local_68.f.abs_value);
          uVar7 = uVar12;
        } while (local_b8._M_string_length != 0);
      }
      if (_Var9._M_p == pcVar1) {
        local_68.f.size = local_68.f.size + (int)(uVar7 - 1) / (int)pcVar1[-1];
      }
      pbVar3 = this->specs;
      local_68.prefix.size_ = (size_t)this->prefix_size;
      local_e8.fill.data_[5] = (pbVar3->fill).data_[5];
      local_e8.width = pbVar3->width;
      local_e8.precision = pbVar3->precision;
      uStack_90._0_1_ = pbVar3->type;
      uStack_90._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
      uStack_90._4_4_ = (pbVar3->fill).data_[0];
      local_e8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
      local_e8.fill.data_._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
      uVar11 = (uint)local_68.f.size + local_68.prefix.size_;
      local_e8._9_1_ = SUB31(uStack_90._1_3_,0);
      local_68.size_ = uVar11;
      local_68.fill = uStack_90._4_4_;
      if ((local_e8._9_1_ & 0xf) == 4) {
        uVar13 = local_e8._0_8_ & 0xffffffff;
        local_68.padding = 0;
        if (uVar11 <= uVar13) {
          local_68.size_ = uVar13;
          local_68.padding = uVar13 - uVar11;
        }
      }
      else if (local_68.f.size < (int)local_e8.precision) {
        local_68.size_ = (uint)local_e8.precision + local_68.prefix.size_;
        local_68.padding = (ulong)(uint)(local_e8.precision - local_68.f.size);
        local_68.fill = L'0';
      }
      else {
        local_68.padding = 0;
      }
      local_68.prefix.data_ = this->prefix;
      local_e8._8_8_ = uStack_90;
      if ((uStack_90 & 0xf00) == 0) {
        local_e8._8_8_ = uStack_90 | 0x200;
      }
      local_98 = local_e8._0_8_;
      local_88 = (wchar_t  [2])local_e8.fill.data_._4_8_;
      awStack_80 = (wchar_t  [2])local_e8.fill.data_._12_8_;
      local_78 = local_e8.fill.data_[5];
      local_68.f.groups = &local_b8;
      local_68.f.sep = wVar5;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_e8,&local_68);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }